

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O2

Stream * rw::xbox::readNativeSkin(Stream *stream,int32 param_2,void *object,int32 offset)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  int32 iVar4;
  Skin *this;
  void *data;
  undefined8 uVar5;
  char *pcVar6;
  FILE *__stream;
  ulong uVar7;
  uint32 vers;
  Error _e;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,&vers);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    if (uVar2 == 5) {
      if (0x34fff < vers) {
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp line: 50"
        ;
        this = (Skin *)(*DAT_00145dd8)(0x70,0x30116);
        *(Skin **)((long)object + (long)offset) = this;
        uVar3 = Stream::readI32(stream);
        Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp line: 55"
        ;
        data = (void *)(*DAT_00145dd8)(0x818,0x30116);
        this->platformData = data;
        Stream::read32(stream,data,0x400);
        Stream::read32(stream,(void *)((long)data + 0x400),0x400);
        iVar4 = Stream::readI32(stream);
        *(int32 *)((long)data + 0x800) = iVar4;
        iVar4 = Stream::readI32(stream);
        this->numWeights = iVar4;
        (*stream->_vptr_Stream[5])(stream,4,1);
        iVar4 = Stream::readI32(stream);
        *(int32 *)((long)data + 0x810) = iVar4;
        uVar7 = (long)iVar4 * (long)*(int *)((long)object + 0x1c);
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp line: 64"
        ;
        uVar5 = (*DAT_00145dd8)(uVar7,0x30116);
        *(undefined8 *)((long)data + 0x808) = uVar5;
        (*stream->_vptr_Stream[4])(stream,uVar5,uVar7 & 0xffffffff);
        Stream::read32(stream,this->inverseMatrices,this->numBones << 6);
        readSkinSplitData(stream,this);
        return stream;
      }
      _e.plugin = 0x116;
      _e.code = 0x80000005;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp"
              ,0x2e);
      __stream = _stderr;
      pcVar6 = dbgsprint(0x80000005,(ulong)vers);
    }
    else {
      _e.plugin = 0x116;
      _e.code = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp"
              ,0x2a);
      __stream = _stderr;
      pcVar6 = dbgsprint(0x80000006,(ulong)uVar2);
    }
  }
  else {
    _e.plugin = 0x116;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xboxskin.cpp"
            ,0x25);
    __stream = _stderr;
    pcVar6 = dbgsprint(0x80000004,"STRUCT");
  }
  fprintf(__stream,"%s\n",pcVar6);
  setError(&_e);
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeSkin(Stream *stream, int32, void *object, int32 offset)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 vers, platform;
	if(!findChunk(stream, ID_STRUCT, nil, &vers)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_XBOX){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	if(vers < 0x35000){
		RWERROR((ERR_VERSION, vers));
		return nil;
	}

	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	int32 numBones = stream->readI32();
	skin->init(numBones, 0, 0);
	NativeSkin *natskin = rwNewT(NativeSkin, 1, MEMDUR_EVENT | ID_SKIN);
	skin->platformData = natskin;
	stream->read32(natskin->table1, 256*sizeof(int32));
	stream->read32(natskin->table2, 256*sizeof(int32));
	natskin->numUsedBones = stream->readI32();
	skin->numWeights = stream->readI32();
	stream->seek(4);	// skip pointer to vertexBuffer
	natskin->stride = stream->readI32();
	int32 size = geometry->numVertices*natskin->stride;
	natskin->vertexBuffer = rwNewT(uint8, size, MEMDUR_EVENT | ID_SKIN);
	stream->read8(natskin->vertexBuffer, size);
	stream->read32(skin->inverseMatrices, skin->numBones*64);

	readSkinSplitData(stream, skin);
	return stream;
}